

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# segment.c
# Opt level: O2

mi_segment_t *
mi_segment_alloc(size_t required,size_t page_alignment,mi_arena_id_t req_arena_id,
                mi_segments_tld_t *tld,mi_page_t **huge_page)

{
  ulong uVar1;
  mi_memid_t memid_00;
  mi_segments_tld_t *tld_00;
  size_t sVar2;
  size_t sVar3;
  ulong uVar4;
  mi_segment_t *segment;
  long lVar5;
  mi_threadid_t mVar6;
  mi_page_t *pmVar7;
  mi_segment_t *pmVar8;
  size_t size;
  _Bool allow_large;
  _Bool _Var9;
  size_t info_slices;
  mi_arena_id_t local_a4;
  mi_segments_tld_t *local_a0;
  mi_memid_t memid;
  mi_commit_mask_t local_70;
  
  local_a4 = req_arena_id;
  sVar2 = mi_segment_calculate_slices(required,&info_slices);
  sVar3 = _mi_current_thread_count();
  local_a0 = tld;
  if ((sVar3 < 2) ||
     (uVar1 = tld->peak_count, uVar4 = mi_option_get(mi_option_eager_commit_delay), uVar4 <= uVar1))
  {
    _Var9 = mi_option_is_enabled(mi_option_eager_commit);
    allow_large = true;
  }
  else {
    allow_large = false;
    _Var9 = false;
  }
  if (page_alignment == 0) {
    page_alignment = 0x2000000;
    sVar3 = 0;
  }
  else {
    sVar3 = info_slices * 0x10000 + 0x1ffffff & 0xfffffffffe000000;
    sVar2 = mi_segment_calculate_slices(required + info_slices * -0x10000 + sVar3,&info_slices);
  }
  size = sVar2 << 0x10;
  segment = (mi_segment_t *)
            _mi_arena_alloc_aligned
                      (size,page_alignment,sVar3,(_Bool)(required != 0 | _Var9),allow_large,local_a4
                       ,&memid);
  sVar3 = info_slices;
  if (segment == (mi_segment_t *)0x0) {
    pmVar8 = (mi_segment_t *)0x0;
  }
  else {
    if (memid.initially_committed == true) {
      mi_commit_mask_create_full(&local_70);
    }
    else {
      mi_commit_mask_create(0,info_slices & 0xffffffffffff,&local_70);
      _Var9 = _mi_os_commit(segment,sVar3 << 0x10,(_Bool *)0x0);
      if (!_Var9) {
        memid_00.initially_committed = memid.initially_committed;
        memid_00.is_pinned = memid.is_pinned;
        memid_00.initially_zero = memid.initially_zero;
        memid_00._19_1_ = memid._19_1_;
        memid_00.memkind = memid.memkind;
        memid_00.mem.os.size = memid.mem.os.size;
        memid_00.mem.os.base = memid.mem.os.base;
        _mi_arena_free(segment,size,0,memid_00);
        return (mi_segment_t *)0x0;
      }
    }
    tld_00 = local_a0;
    (segment->memid).is_pinned = memid.is_pinned;
    (segment->memid).initially_committed = memid.initially_committed;
    (segment->memid).initially_zero = (_Bool)memid.initially_zero;
    (segment->memid).field_0x13 = memid._19_1_;
    (segment->memid).memkind = memid.memkind;
    (segment->memid).mem.os.base = memid.mem.os.base;
    (segment->memid).mem.os.size = memid.mem.os.size;
    segment->allow_decommit = (_Bool)(memid.is_pinned ^ 1);
    if (memid.is_pinned == false) {
      lVar5 = mi_option_get(mi_option_purge_delay);
      _Var9 = -1 < lVar5;
    }
    else {
      _Var9 = false;
    }
    segment->allow_purge = _Var9;
    segment->segment_size = size;
    segment->subproc = tld_00->subproc;
    (segment->commit_mask).mask[0] = local_70.mask[0];
    (segment->commit_mask).mask[1] = local_70.mask[1];
    (segment->commit_mask).mask[2] = local_70.mask[2];
    (segment->commit_mask).mask[3] = local_70.mask[3];
    (segment->commit_mask).mask[4] = local_70.mask[4];
    (segment->commit_mask).mask[5] = local_70.mask[5];
    (segment->commit_mask).mask[6] = local_70.mask[6];
    (segment->commit_mask).mask[7] = local_70.mask[7];
    segment->purge_expire = 0;
    mi_commit_mask_create_empty(&segment->purge_mask);
    mi_segments_track_size(size,tld_00);
    _mi_segment_map_allocated_at(segment);
    if ((segment->memid).initially_zero == false) {
      memset(&segment->next,0,sVar2 * 0x60 + 200);
    }
    sVar3 = 0x200;
    if (sVar2 < 0x200) {
      sVar3 = sVar2;
    }
    segment->segment_slices = sVar2;
    segment->segment_info_slices = info_slices;
    mVar6 = _mi_thread_id();
    LOCK();
    segment->thread_id = mVar6;
    UNLOCK();
    segment->cookie = _mi_heap_main.cookie ^ (ulong)segment;
    segment->slice_entries = sVar3;
    segment->kind = (uint)(required != 0);
    _mi_stat_increase(&tld_00->stats->page_committed,segment->segment_info_slices << 0x10);
    pmVar7 = mi_segment_span_allocate(segment,0,info_slices);
    pmVar8 = (mi_segment_t *)0x0;
    if (pmVar7 != (mi_page_t *)0x0) {
      segment->used = 0;
      pmVar8 = segment;
      if (segment->kind == MI_SEGMENT_NORMAL) {
        mi_segment_span_free(segment,info_slices,segment->slice_entries - info_slices,false,tld_00);
      }
      else {
        pmVar7 = mi_segment_span_allocate(segment,info_slices,sVar2 - info_slices);
        *huge_page = pmVar7;
      }
    }
  }
  return pmVar8;
}

Assistant:

static mi_segment_t* mi_segment_alloc(size_t required, size_t page_alignment, mi_arena_id_t req_arena_id, mi_segments_tld_t* tld, mi_page_t** huge_page)
{
  mi_assert_internal((required==0 && huge_page==NULL) || (required>0 && huge_page != NULL));

  // calculate needed sizes first
  size_t info_slices;
  size_t segment_slices = mi_segment_calculate_slices(required, &info_slices);
  mi_assert_internal(segment_slices > 0 && segment_slices <= UINT32_MAX);

  // Commit eagerly only if not the first N lazy segments (to reduce impact of many threads that allocate just a little)
  const bool eager_delay = (// !_mi_os_has_overcommit() &&             // never delay on overcommit systems
                            _mi_current_thread_count() > 1 &&       // do not delay for the first N threads
                            tld->peak_count < (size_t)mi_option_get(mi_option_eager_commit_delay));
  const bool eager = !eager_delay && mi_option_is_enabled(mi_option_eager_commit);
  bool commit = eager || (required > 0);

  // Allocate the segment from the OS
  mi_segment_t* segment = mi_segment_os_alloc(required, page_alignment, eager_delay, req_arena_id,
                                              &segment_slices, &info_slices, commit, tld);
  if (segment == NULL) return NULL;

  // zero the segment info? -- not always needed as it may be zero initialized from the OS
  if (!segment->memid.initially_zero) {
    ptrdiff_t ofs    = offsetof(mi_segment_t, next);
    size_t    prefix = offsetof(mi_segment_t, slices) - ofs;
    size_t    zsize  = prefix + (sizeof(mi_slice_t) * (segment_slices + 1)); // one more
    _mi_memzero((uint8_t*)segment + ofs, zsize);
  }

  // initialize the rest of the segment info
  const size_t slice_entries = (segment_slices > MI_SLICES_PER_SEGMENT ? MI_SLICES_PER_SEGMENT : segment_slices);
  segment->segment_slices = segment_slices;
  segment->segment_info_slices = info_slices;
  segment->thread_id = _mi_thread_id();
  segment->cookie = _mi_ptr_cookie(segment);
  segment->slice_entries = slice_entries;
  segment->kind = (required == 0 ? MI_SEGMENT_NORMAL : MI_SEGMENT_HUGE);

  // _mi_memzero(segment->slices, sizeof(mi_slice_t)*(info_slices+1));
  _mi_stat_increase(&tld->stats->page_committed, mi_segment_info_size(segment));

  // set up guard pages
  size_t guard_slices = 0;
  if (MI_SECURE>0) {
    // in secure mode, we set up a protected page in between the segment info
    // and the page data, and at the end of the segment.
    size_t os_pagesize = _mi_os_page_size();
    _mi_os_protect((uint8_t*)segment + mi_segment_info_size(segment) - os_pagesize, os_pagesize);
    uint8_t* end = (uint8_t*)segment + mi_segment_size(segment) - os_pagesize;
    mi_segment_ensure_committed(segment, end, os_pagesize);
    _mi_os_protect(end, os_pagesize);
    if (slice_entries == segment_slices) segment->slice_entries--; // don't use the last slice :-(
    guard_slices = 1;
  }

  // reserve first slices for segment info
  mi_page_t* page0 = mi_segment_span_allocate(segment, 0, info_slices);
  mi_assert_internal(page0!=NULL); if (page0==NULL) return NULL; // cannot fail as we always commit in advance
  mi_assert_internal(segment->used == 1);
  segment->used = 0; // don't count our internal slices towards usage

  // initialize initial free pages
  if (segment->kind == MI_SEGMENT_NORMAL) { // not a huge page
    mi_assert_internal(huge_page==NULL);
    mi_segment_span_free(segment, info_slices, segment->slice_entries - info_slices, false /* don't purge */, tld);
  }
  else {
    mi_assert_internal(huge_page!=NULL);
    mi_assert_internal(mi_commit_mask_is_empty(&segment->purge_mask));
    mi_assert_internal(mi_commit_mask_is_full(&segment->commit_mask));
    *huge_page = mi_segment_span_allocate(segment, info_slices, segment_slices - info_slices - guard_slices);
    mi_assert_internal(*huge_page != NULL); // cannot fail as we commit in advance
  }

  mi_assert_expensive(mi_segment_is_valid(segment,tld));
  return segment;
}